

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.cpp
# Opt level: O3

spv_operand_pattern_t *
spvAlternatePatternFollowingImmediate
          (spv_operand_pattern_t *__return_storage_ptr__,spv_operand_pattern_t *pattern)

{
  pointer psVar1;
  spv_operand_pattern_t *alternatePattern;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_spv_operand_type_t_*,_std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>_>_>
  it;
  pointer local_38;
  pointer local_30;
  undefined4 local_24;
  pointer local_20;
  
  local_38 = (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
             _M_impl.super__Vector_impl_data._M_start;
  local_30 = (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  local_24 = 3;
  std::
  __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<spv_operand_type_t_const*,std::vector<spv_operand_type_t,std::allocator<spv_operand_type_t>>>>,__gnu_cxx::__ops::_Iter_equals_val<spv_operand_type_t_const>>
            (&local_20);
  if (local_20 ==
      (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl
      .super__Vector_impl_data._M_start) {
    psVar1 = (pointer)operator_new(4);
    (__return_storage_ptr__->
    super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl.
    super__Vector_impl_data._M_start = psVar1;
    (__return_storage_ptr__->
    super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = psVar1 + 1;
    *psVar1 = SPV_OPERAND_TYPE_OPTIONAL_CIV;
    (__return_storage_ptr__->
    super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl.
    super__Vector_impl_data._M_finish = psVar1 + 1;
  }
  else {
    local_30 = (pointer)CONCAT44(local_30._4_4_,0x32);
    std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::vector
              (__return_storage_ptr__,
               ((long)(pattern->
                      super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)local_20 >> 2) + 2,
               (value_type *)&local_30,(allocator_type *)&local_38);
    (__return_storage_ptr__->
    super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl.
    super__Vector_impl_data._M_start[1] = SPV_OPERAND_TYPE_RESULT_ID;
  }
  return __return_storage_ptr__;
}

Assistant:

spv_operand_pattern_t spvAlternatePatternFollowingImmediate(
    const spv_operand_pattern_t& pattern) {
  auto it =
      std::find(pattern.crbegin(), pattern.crend(), SPV_OPERAND_TYPE_RESULT_ID);
  if (it != pattern.crend()) {
    spv_operand_pattern_t alternatePattern(it - pattern.crbegin() + 2,
                                           SPV_OPERAND_TYPE_OPTIONAL_CIV);
    alternatePattern[1] = SPV_OPERAND_TYPE_RESULT_ID;
    return alternatePattern;
  }

  // No result-id found, so just expect CIVs.
  return {SPV_OPERAND_TYPE_OPTIONAL_CIV};
}